

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManSerializer.cpp
# Opt level: O3

void __thiscall
adios2::format::DataManSerializer::Log
          (DataManSerializer *this,int level,string *message,bool mpi,bool endline)

{
  int iVar1;
  ostream *poVar2;
  undefined8 uVar3;
  undefined3 in_register_00000081;
  ScopedTimer __var2583;
  Comm CStack_68;
  undefined4 local_5c;
  ScopedTimer local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  local_5c = CONCAT31(in_register_00000081,endline);
  if (Log(int,std::__cxx11::string_const&,bool,bool)::__var583 == '\0') {
    iVar1 = __cxa_guard_acquire(&Log(int,std::__cxx11::string_const&,bool,bool)::__var583);
    if (iVar1 != 0) {
      uVar3 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/dataman/DataManSerializer.cpp"
                                  ,
                                  "void adios2::format::DataManSerializer::Log(const int, const std::string &, const bool, const bool)"
                                  ,0x247);
      Log::__var583 = (void *)ps_timer_create_(uVar3);
      __cxa_guard_release(&Log(int,std::__cxx11::string_const&,bool,bool)::__var583);
    }
  }
  local_58.m_timer = Log::__var583;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  local_48 = 0;
  local_40[0] = 0;
  local_50 = local_40;
  helper::Comm::World(&CStack_68,(string *)this->m_Comm);
  iVar1 = helper::Comm::Rank(&CStack_68);
  helper::Comm::~Comm(&CStack_68);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (level <= this->m_Verbosity) {
    if (mpi) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[Rank ",6);
      poVar2 = (ostream *)std::ostream::operator<<(&std::cout,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] ",2);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(message->_M_dataplus)._M_p,message->_M_string_length);
    if ((char)local_5c != '\0') {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
    }
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&local_58);
  return;
}

Assistant:

void DataManSerializer::Log(const int level, const std::string &message, const bool mpi,
                            const bool endline)
{
    PERFSTUBS_SCOPED_TIMER_FUNC();
    const int rank = m_Comm.World().Rank();

    if (m_Verbosity >= level)
    {
        if (mpi)
        {
            std::cout << "[Rank " << rank << "] ";
        }
        std::cout << message;
        if (endline)
        {
            std::cout << std::endl;
        }
    }
}